

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

L2NormalizeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_l2normalize(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  L2NormalizeLayerParams *pLVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_l2normalize(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_l2normalize(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pLVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::L2NormalizeLayerParams>(arena);
    (this->layer_).l2normalize_ = pLVar2;
  }
  return (L2NormalizeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::L2NormalizeLayerParams* NeuralNetworkLayer::_internal_mutable_l2normalize() {
  if (!_internal_has_l2normalize()) {
    clear_layer();
    set_has_l2normalize();
    layer_.l2normalize_ = CreateMaybeMessage< ::CoreML::Specification::L2NormalizeLayerParams >(GetArenaForAllocation());
  }
  return layer_.l2normalize_;
}